

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

Vector3f __thiscall blinnPhong::sample(blinnPhong *this,Ray *ray,Hit *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  Material *pMVar7;
  float *pfVar8;
  Vector3f *pVVar9;
  Hit *in_RCX;
  result_type_conflict rVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar15 [16];
  Vector3f VVar16;
  Vector3f local_2b0;
  Vector3f local_2a4;
  Vector3f local_298;
  Vector3f local_28c;
  Vector3f local_280;
  Vector3f local_274;
  Vector3f local_268;
  Vector3f local_25c;
  Vector3f local_250;
  Vector3f local_244;
  Vector3f local_238;
  undefined1 local_22c [12];
  undefined1 local_220 [24];
  Vector3f local_208;
  Vector3f local_1fc;
  Vector3f local_1f0;
  Vector3f local_1e4;
  Vector3f local_1d8;
  int local_1cc;
  int i;
  Vector3f local_1bc;
  Vector3f local_1b0;
  Vector3f local_1a4;
  Vector3f local_198;
  undefined1 local_18c [12];
  undefined1 local_180 [12];
  Ray local_174;
  Ray local_15c;
  Vector3f local_144;
  Vector3f local_138;
  Vector3f local_12c;
  Vector3f local_120;
  Vector3f local_114;
  Vector3f local_108;
  Vector3f local_fc;
  Vector3f local_f0;
  Vector3f local_e4;
  Vector3f local_d8;
  Vector3f local_cc;
  Vector3f local_c0;
  undefined1 local_b4 [24];
  undefined1 local_9c [8];
  Vector3f y;
  Vector3f x;
  Vector3f normal;
  float factor;
  float r;
  float cos_v;
  float sin_v;
  float v;
  float u;
  uniform_real_distribution<float> uniform;
  default_random_engine generator;
  int max_iters;
  float prob_spec;
  Vector3f spec;
  Vector3f diff;
  float shininess;
  Hit *h_local;
  Ray *ray_local;
  blinnPhong *this_local;
  Vector3f *output;
  undefined8 uVar14;
  undefined1 extraout_var [12];
  
  pMVar7 = Hit::getMaterial(in_RCX);
  pfVar8 = Material::getShininess(pMVar7);
  fVar11 = *pfVar8;
  pMVar7 = Hit::getMaterial(in_RCX);
  pVVar9 = Material::getDiffuseColor(pMVar7);
  Vector3f::Vector3f((Vector3f *)(spec.m_elements + 1),pVVar9);
  pMVar7 = Hit::getMaterial(in_RCX);
  pVVar9 = Material::getSpecularColor(pMVar7);
  Vector3f::Vector3f((Vector3f *)&max_iters,pVVar9);
  pfVar8 = Vector3f::operator[]((Vector3f *)(spec.m_elements + 1),0);
  fVar12 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)(spec.m_elements + 1),1);
  fVar1 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)(spec.m_elements + 1),2);
  fVar2 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)&max_iters,0);
  fVar3 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)&max_iters,1);
  fVar4 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)&max_iters,2);
  fVar5 = *pfVar8;
  iVar6 = rand();
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&uniform,
             (long)iVar6);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)&v,0.0,1.0);
  sin_v = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&v,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &uniform);
  rVar10 = std::uniform_real_distribution<float>::operator()
                     ((uniform_real_distribution<float> *)&v,
                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                      &uniform);
  cos_v = rVar10 * 6.2831855;
  dVar13 = sin((double)cos_v);
  r = (float)dVar13;
  dVar13 = cos((double)cos_v);
  factor = (float)dVar13;
  Vector3f::Vector3f((Vector3f *)(x.m_elements + 1),0.0);
  Vector3f::Vector3f((Vector3f *)(y.m_elements + 1),0.0);
  Vector3f::Vector3f((Vector3f *)local_9c,0.0);
  Hit::getNormal((Hit *)(local_b4 + 0xc));
  ::operator-((Vector3f *)this);
  rVar10 = std::uniform_real_distribution<float>::operator()
                     ((uniform_real_distribution<float> *)&v,
                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                      &uniform);
  if (rVar10 <= 1.0 / ((fVar12 + fVar1 + fVar2) / (fVar3 + fVar4 + fVar5) + 1.0)) {
    Ray::getDirection(&local_15c);
    Ray::getDirection((Ray *)(local_180 + 0xc));
    Hit::getNormal((Hit *)local_180);
    fVar12 = Vector3f::dot((Vector3f *)(local_180 + 0xc),(Vector3f *)local_180);
    Hit::getNormal((Hit *)local_18c);
    ::operator*(fVar12 * 2.0,&local_174._direction);
    ::operator-(&local_15c._direction,&local_15c._origin);
    Vector3f::normalized(&local_144);
    Vector3f::operator=((Vector3f *)(x.m_elements + 1),&local_144);
    Vector3f::Vector3f(&local_1b0,1.0,2.0,3.0);
    Vector3f::cross(&local_1a4,&local_1b0,(Vector3f *)(x.m_elements + 1));
    Vector3f::normalized(&local_198);
    Vector3f::operator=((Vector3f *)(y.m_elements + 1),&local_198);
    Vector3f::cross((Vector3f *)&stack0xfffffffffffffe38,(Vector3f *)(y.m_elements + 1),
                    (Vector3f *)(x.m_elements + 1));
    Vector3f::normalized(&local_1bc);
    Vector3f::operator=((Vector3f *)local_9c,&local_1bc);
    for (local_1cc = 0; local_1cc < 10; local_1cc = local_1cc + 1) {
      dVar13 = pow((double)sin_v,(double)(1.0 / (fVar11 + 1.0)));
      fVar12 = (float)dVar13;
      dVar13 = sqrt((double)(-fVar12 * fVar12 + 1.0));
      ::operator*(fVar12,&local_1e4);
      ::operator*(r,&local_208);
      ::operator*(factor,(Vector3f *)(local_220 + 0xc));
      operator+(&local_1fc,&local_208);
      ::operator*((float)dVar13,&local_1f0);
      operator+(&local_1d8,&local_1e4);
      Vector3f::operator=((Vector3f *)this,&local_1d8);
      Hit::getNormal((Hit *)local_220);
      auVar15._0_4_ = Vector3f::dot((Vector3f *)this,(Vector3f *)local_220);
      auVar15._4_12_ = extraout_var;
      uVar14 = auVar15._0_8_;
      fVar12 = 0.0;
      if (0.0 < auVar15._0_4_) goto LAB_0014a84c;
      sin_v = std::uniform_real_distribution<float>::operator()
                        ((uniform_real_distribution<float> *)&v,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         &uniform);
      dVar13 = fmod((double)cos_v + 0.4,6.283185307179586);
      cos_v = (float)dVar13;
      dVar13 = sin((double)cos_v);
      r = (float)dVar13;
      dVar13 = cos((double)cos_v);
      factor = (float)dVar13;
    }
    dVar13 = sqrt((double)sin_v);
    fVar11 = (float)dVar13;
    dVar13 = sqrt((double)(-fVar11 * fVar11 + 1.0));
    Hit::getNormal((Hit *)local_22c);
    Vector3f::operator=((Vector3f *)(x.m_elements + 1),(Vector3f *)local_22c);
    Vector3f::Vector3f(&local_250,1.0,2.0,3.0);
    Vector3f::cross(&local_244,&local_250,(Vector3f *)(x.m_elements + 1));
    Vector3f::normalized(&local_238);
    Vector3f::operator=((Vector3f *)(y.m_elements + 1),&local_238);
    Vector3f::cross(&local_268,(Vector3f *)(y.m_elements + 1),(Vector3f *)(x.m_elements + 1));
    Vector3f::normalized(&local_25c);
    Vector3f::operator=((Vector3f *)local_9c,&local_25c);
    ::operator*(fVar11,&local_280);
    ::operator*(r,&local_2a4);
    ::operator*(factor,&local_2b0);
    operator+(&local_298,&local_2a4);
    ::operator*((float)dVar13,&local_28c);
    VVar16 = operator+(&local_274,&local_280);
    fVar12 = VVar16.m_elements[2];
    Vector3f::operator=((Vector3f *)this,&local_274);
    uVar14 = extraout_XMM0_Qa_00;
  }
  else {
    dVar13 = sqrt((double)sin_v);
    fVar11 = (float)dVar13;
    dVar13 = sqrt((double)(-fVar11 * fVar11 + 1.0));
    Hit::getNormal((Hit *)local_b4);
    Vector3f::operator=((Vector3f *)(x.m_elements + 1),(Vector3f *)local_b4);
    Vector3f::Vector3f(&local_d8,1.0,2.0,3.0);
    Vector3f::cross(&local_cc,&local_d8,(Vector3f *)(x.m_elements + 1));
    Vector3f::normalized(&local_c0);
    Vector3f::operator=((Vector3f *)(y.m_elements + 1),&local_c0);
    Vector3f::cross(&local_f0,(Vector3f *)(y.m_elements + 1),(Vector3f *)(x.m_elements + 1));
    Vector3f::normalized(&local_e4);
    Vector3f::operator=((Vector3f *)local_9c,&local_e4);
    ::operator*(fVar11,&local_108);
    ::operator*(r,&local_12c);
    ::operator*(factor,&local_138);
    operator+(&local_120,&local_12c);
    ::operator*((float)dVar13,&local_114);
    VVar16 = operator+(&local_fc,&local_108);
    fVar12 = VVar16.m_elements[2];
    Vector3f::operator=((Vector3f *)this,&local_fc);
    uVar14 = extraout_XMM0_Qa;
  }
LAB_0014a84c:
  VVar16.m_elements[2] = fVar12;
  VVar16.m_elements[0] = (float)(int)uVar14;
  VVar16.m_elements[1] = (float)(int)((ulong)uVar14 >> 0x20);
  return (Vector3f)VVar16.m_elements;
}

Assistant:

Vector3f blinnPhong::sample(const Ray &ray, Hit &h) const {
    float shininess = h.getMaterial()->getShininess();
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));
    int max_iters = 10;

    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> uniform(0.f, 1.f);

    float u = uniform(generator);
    float v = 2.f * (float)M_PI * uniform(generator);
    float sin_v = sin(v);
    float cos_v = cos(v);

    float r;
    float factor;
    Vector3f normal;
    Vector3f x;
    Vector3f y;
    Vector3f output = -h.getNormal();

    if (uniform(generator) > prob_spec) {
        // do diffuse distribution
        r = sqrt(u);
        factor = sqrt(1-r*r);
        normal = h.getNormal();

        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();
        output = r * normal + factor * (sin_v * x + cos_v * y);
    } else {
        // do specular distribution
        normal = (ray.getDirection() -
                  2 * Vector3f::dot(ray.getDirection(), h.getNormal()) * h.getNormal()).normalized();
        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();

        for (int i=0; i<max_iters; i++) {
            r = pow(u, 1.f / (1.f + shininess));
            factor = sqrt(1 - r * r);
            output = r * normal + factor * (sin_v * x + cos_v * y);

            if (Vector3f::dot(output, h.getNormal()) > 0) {
                return output;
            }

            u = uniform(generator);
            v = fmod(v + 0.4, 2 * M_PI);
            sin_v = sin(v); cos_v = cos(v);
        }

        r = sqrt(u);
        factor = sqrt(1-r*r);
        normal = h.getNormal();
        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();
        output = r * normal + factor * (sin_v * x + cos_v * y);
    }

    return output;
}